

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O3

uchar readuchar(FILE *f)

{
  undefined8 in_RAX;
  size_t sVar1;
  uchar c1;
  uchar local_1;
  
  local_1 = (uchar)((ulong)in_RAX >> 0x38);
  sVar1 = fread(&local_1,1,1,(FILE *)f);
  if (sVar1 == 0) {
    readuchar_cold_1();
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static unsigned char readuchar(FILE * f)
{
    unsigned char c1;
    if (!fread(&c1, 1, 1, f)) {
        fprintf(stderr,
                "\nError: fread return a number of element different from the expected.\n");
        return 0;
    }
    return c1;
}